

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::response_writer::write_headers(response_writer *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  void *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hh;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  __string_type res_headers;
  ostringstream local_188 [8];
  ostringstream os;
  response_writer *this_local;
  
  this->header_out = true;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar4 = std::operator<<((ostream *)local_188,"HTTP/1.1 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->code);
  poVar4 = std::operator<<(poVar4," ");
  pmVar5 = std::
           unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)status_codes_abi_cxx11_,&this->code);
  poVar4 = std::operator<<(poVar4,(string *)pmVar5);
  std::operator<<(poVar4,"\r\n");
  std::__cxx11::ostringstream::str();
  iVar1 = this->s;
  pvVar6 = (void *)std::__cxx11::string::data();
  iVar3 = std::__cxx11::string::size();
  send(iVar1,pvVar6,(long)iVar3,0x4000);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->headers);
  h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->headers);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&h);
    if (!bVar2) break;
    hh.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    std::operator+(&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   hh.field_2._8_8_,": ");
    std::operator+(&local_218,&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (hh.field_2._8_8_ + 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,"\r\n");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iVar1 = this->s;
    pvVar6 = (void *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::size();
    send(iVar1,pvVar6,(long)iVar3,0x4000);
    std::__cxx11::string::~string((string *)local_1f8);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  send(this->s,"\r\n",2,0x4000);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

inline void response_writer::write_headers() {
  header_out = true;
  std::ostringstream os;
  os << "HTTP/1.1 " << code << " " << status_codes[code] << "\r\n";
  auto res_headers = os.str();
  send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
  for (auto& h : headers) {
    auto hh = h.first + ": " + h.second + "\r\n";
    send(s, hh.data(), (int) hh.size(), MSG_NOSIGNAL);
  }
  send(s, "\r\n", 2, MSG_NOSIGNAL);
}